

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcProject::IfcProject(IfcProject *this)

{
  IfcProject *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x150,"IfcProject");
  IfcObject::IfcObject(&this->super_IfcObject,&PTR_construction_vtable_24__00f0fa08);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcProject,_4UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcProject,_4UL> *)
             &(this->super_IfcObject).field_0xd0,&PTR_construction_vtable_24__00f0fa80);
  *(undefined8 *)&this->super_IfcObject = 0xf0f950;
  *(undefined8 *)&this->field_0x150 = 0xf0f9f0;
  *(undefined8 *)&(this->super_IfcObject).field_0x88 = 0xf0f978;
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0xf0f9a0;
  *(undefined8 *)&(this->super_IfcObject).field_0xd0 = 0xf0f9c8;
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &(this->super_IfcObject).field_0xe0);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->Phase);
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_1UL,_0UL>::
  ListOf(&this->RepresentationContexts);
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcUnitAssignment>::Lazy
            (&this->UnitsInContext,(LazyObject *)0x0);
  return;
}

Assistant:

IfcProject() : Object("IfcProject") {}